

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

int Saig_TsiComputePrefix(Saig_Tsim_t *p,uint *pState,int nWords)

{
  int iVar1;
  uint *puVar2;
  int local_40;
  int i;
  int Hash;
  uint *pPrev;
  uint *pEntry;
  int nWords_local;
  uint *pState_local;
  Saig_Tsim_t *p_local;
  
  iVar1 = Saig_TsiStateHash(pState,nWords,p->nBins);
  pPrev = p->pBins[iVar1];
  while( true ) {
    if (pPrev == (uint *)0x0) {
      return -1;
    }
    iVar1 = memcmp(pPrev,pState,(long)nWords << 2);
    if (iVar1 == 0) break;
    pPrev = Saig_TsiNext(pPrev,nWords);
  }
  local_40 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vStates);
    if (iVar1 <= local_40) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                    ,0x17a,"int Saig_TsiComputePrefix(Saig_Tsim_t *, unsigned int *, int)");
    }
    puVar2 = (uint *)Vec_PtrEntry(p->vStates,local_40);
    if (puVar2 == pPrev) break;
    local_40 = local_40 + 1;
  }
  return local_40;
}

Assistant:

int Saig_TsiComputePrefix( Saig_Tsim_t * p, unsigned * pState, int nWords )
{
    unsigned * pEntry, * pPrev;
    int Hash, i;
    Hash = Saig_TsiStateHash( pState, nWords, p->nBins );
    for ( pEntry = p->pBins[Hash]; pEntry; pEntry = Saig_TsiNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
        {
            Vec_PtrForEachEntry( unsigned *, p->vStates, pPrev, i )
            {
                if ( pPrev == pEntry )
                    return i;
            }
            assert( 0 );
            return -1;
        }
    return -1;
}